

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O2

void __thiscall
Assignment::Assignment
          (Assignment *this,ptr<Operation> *operation,ptr<Expression> *left,ptr<Expression> *right)

{
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&operation->super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&left->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,&right->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  BinaryOperator::BinaryOperator
            (&this->super_BinaryOperator,(ptr<Operation> *)&local_38,(ptr<Expression> *)&local_48,
             (ptr<Expression> *)&_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_00134ae8;
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }